

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O3

void __thiscall PSVIWriterHandlers::endPrefixMapping(PSVIWriterHandlers *this,XMLCh *prefix)

{
  XMLCh XVar1;
  XMLCh XVar2;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar3;
  bool bVar4;
  char16_t *pcVar5;
  ulong uVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  char16_t *pcVar9;
  RefHashTableBucketElem<char16_t> *pRVar10;
  char16_t cVar11;
  BaseRefVectorOf<char16_t> *this_00;
  XMLSize_t getAt;
  XMLCh *uri;
  XMLCh *pre;
  char16_t *local_40;
  char16_t *local_38;
  
  this_00 = &this->fNamespaces->super_BaseRefVectorOf<char16_t>;
  if (this_00->fCurCount == 0) {
    return;
  }
  getAt = 0;
LAB_0010e5a5:
  pRVar3 = this->fPrefixMap;
  pcVar5 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(this_00,getAt);
  if ((pcVar5 == (char16_t *)0x0) || (uVar6 = (ulong)(ushort)*pcVar5, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    cVar11 = pcVar5[1];
    if (cVar11 != L'\0') {
      pcVar9 = pcVar5 + 2;
      do {
        uVar6 = (ulong)(ushort)cVar11 + (uVar6 >> 0x18) + uVar6 * 0x26;
        cVar11 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while (cVar11 != L'\0');
    }
    uVar6 = uVar6 % pRVar3->fHashModulus;
  }
  pRVar10 = pRVar3->fBucketList[uVar6];
  if (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0) {
    do {
      bVar4 = xercesc_4_0::StringHasher::equals
                        ((StringHasher *)&pRVar3->field_0x30,pcVar5,pRVar10->fKey);
      if (bVar4) {
        pXVar7 = pRVar10->fData;
        goto LAB_0010e63d;
      }
      pRVar10 = pRVar10->fNext;
    } while (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0);
  }
  pXVar7 = (XMLCh *)0x0;
LAB_0010e63d:
  if (pXVar7 != prefix) {
    pXVar8 = prefix;
    if ((prefix == (XMLCh *)0x0) || (pXVar7 == (XMLCh *)0x0)) {
      if (pXVar7 == (XMLCh *)0x0) {
        if (prefix == (XMLCh *)0x0) goto LAB_0010e6ac;
LAB_0010e68d:
        XVar1 = *pXVar8;
      }
      else {
        XVar1 = *pXVar7;
        if ((prefix != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_0010e68d;
      }
      if (XVar1 == L'\0') goto LAB_0010e6ac;
    }
    else {
      do {
        XVar1 = *pXVar7;
        if (XVar1 == L'\0') goto LAB_0010e68d;
        pXVar7 = pXVar7 + 1;
        XVar2 = *pXVar8;
        pXVar8 = pXVar8 + 1;
      } while (XVar1 == XVar2);
    }
    getAt = (XMLSize_t)((int)getAt + 1);
    this_00 = &this->fNamespaces->super_BaseRefVectorOf<char16_t>;
    if (this_00->fCurCount <= getAt) {
      return;
    }
    goto LAB_0010e5a5;
  }
LAB_0010e6ac:
  pcVar5 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                     (&this->fNamespaces->super_BaseRefVectorOf<char16_t>,getAt);
  pRVar3 = this->fPrefixMap;
  if ((pcVar5 == (char16_t *)0x0) || (uVar6 = (ulong)(ushort)*pcVar5, uVar6 == 0)) {
    uVar6 = 0;
  }
  else {
    cVar11 = pcVar5[1];
    if (cVar11 != L'\0') {
      pcVar9 = pcVar5 + 2;
      do {
        uVar6 = (ulong)(ushort)cVar11 + (uVar6 >> 0x18) + uVar6 * 0x26;
        cVar11 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while (cVar11 != L'\0');
    }
    uVar6 = uVar6 % pRVar3->fHashModulus;
  }
  pRVar10 = pRVar3->fBucketList[uVar6];
  local_40 = pcVar5;
  if (pRVar10 == (RefHashTableBucketElem<char16_t> *)0x0) {
    pcVar9 = (char16_t *)0x0;
  }
  else {
    pcVar9 = (char16_t *)0x0;
    do {
      bVar4 = xercesc_4_0::StringHasher::equals
                        ((StringHasher *)&pRVar3->field_0x30,pcVar5,pRVar10->fKey);
      if (bVar4) {
        pcVar9 = pRVar10->fData;
        break;
      }
      pRVar10 = pRVar10->fNext;
    } while (pRVar10 != (RefHashTableBucketElem<char16_t> *)0x0);
  }
  local_38 = pcVar9;
  xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>::removeKey
            (this->fPrefixMap,pcVar5);
  (*(this->fNamespaces->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[4])
            (this->fNamespaces,getAt);
  xercesc_4_0::XMLString::release(&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  return;
}

Assistant:

void PSVIWriterHandlers::endPrefixMapping(const XMLCh* const prefix) {
	for (unsigned int i=0; i < fNamespaces->size(); i++) {
		if (XMLString::equals(fPrefixMap->get(fNamespaces->elementAt(i)), prefix)) {
			XMLCh* uri = fNamespaces->elementAt(i);
			XMLCh* pre = fPrefixMap->get(uri);
			fPrefixMap->removeKey(uri);
			fNamespaces->removeElementAt(i);
			XMLString::release(&uri);
			XMLString::release(&pre);
			break;
		}
	}
}